

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O0

void do_outfit(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  int iVar2;
  CClass *pCVar3;
  OBJ_DATA *pOVar4;
  const_reference pvVar5;
  OBJ_INDEX_DATA *in_RSI;
  CHAR_DATA *in_RDI;
  AFFECT_DATA af;
  int vnum;
  int sn;
  int shield;
  int feet;
  int hands;
  int legs;
  int arms;
  int body;
  int i;
  OBJ_DATA *obj;
  undefined1 in_stack_000011f7;
  OBJ_DATA *in_stack_000011f8;
  CHAR_DATA *in_stack_00001200;
  CHAR_DATA *in_stack_ffffffffffffff38;
  PC_DATA *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  CHAR_DATA *ch_00;
  int local_38;
  int local_1c;
  undefined8 uVar6;
  
  ch_00 = in_RDI;
  iVar2 = skill_lookup((char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  bVar1 = is_affected(ch_00,iVar2);
  if (bVar1) {
    send_to_char((char *)ch_00,
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  }
  else if ((in_RDI->level < 0x1a) || (bVar1 = is_immortal(in_stack_ffffffffffffff38), bVar1)) {
    in_RDI->pcdata->condition[2] = 1;
    in_RDI->pcdata->condition[3] = 1;
    pCVar3 = char_data::Class(ch_00);
    iVar2 = CClass::GetIndex(pCVar3);
    if (iVar2 != 0xb) {
      pCVar3 = char_data::Class(ch_00);
      CClass::GetIndex(pCVar3);
    }
    pOVar4 = get_eq_char(in_RDI,5);
    if (pOVar4 == (OBJ_DATA *)0x0) {
      get_obj_index(in_stack_ffffffffffffff4c);
      pOVar4 = create_object(in_RSI,(int)((ulong)pOVar4 >> 0x20));
      pOVar4->cost = 0;
      obj_to_char((OBJ_DATA *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      wear_obj(in_stack_00001200,in_stack_000011f8,(bool)in_stack_000011f7);
    }
    pOVar4 = get_eq_char(in_RDI,7);
    if (pOVar4 == (OBJ_DATA *)0x0) {
      get_obj_index(in_stack_ffffffffffffff4c);
      pOVar4 = create_object(in_RSI,(int)((ulong)pOVar4 >> 0x20));
      pOVar4->cost = 0;
      obj_to_char((OBJ_DATA *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      wear_obj(in_stack_00001200,in_stack_000011f8,(bool)in_stack_000011f7);
    }
    pOVar4 = get_eq_char(in_RDI,8);
    if (pOVar4 == (OBJ_DATA *)0x0) {
      get_obj_index(in_stack_ffffffffffffff4c);
      pOVar4 = create_object(in_RSI,(int)((ulong)pOVar4 >> 0x20));
      pOVar4->cost = 0;
      obj_to_char((OBJ_DATA *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      wear_obj(in_stack_00001200,in_stack_000011f8,(bool)in_stack_000011f7);
    }
    pOVar4 = get_eq_char(in_RDI,9);
    if (pOVar4 == (OBJ_DATA *)0x0) {
      get_obj_index(in_stack_ffffffffffffff4c);
      pOVar4 = create_object(in_RSI,(int)((ulong)pOVar4 >> 0x20));
      pOVar4->cost = 0;
      obj_to_char((OBJ_DATA *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      wear_obj(in_stack_00001200,in_stack_000011f8,(bool)in_stack_000011f7);
    }
    pOVar4 = get_eq_char(in_RDI,10);
    if (pOVar4 == (OBJ_DATA *)0x0) {
      get_obj_index(in_stack_ffffffffffffff4c);
      pOVar4 = create_object(in_RSI,(int)((ulong)pOVar4 >> 0x20));
      pOVar4->cost = 0;
      obj_to_char((OBJ_DATA *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      wear_obj(in_stack_00001200,in_stack_000011f8,(bool)in_stack_000011f7);
    }
    pOVar4 = get_eq_char(in_RDI,0x10);
    if (pOVar4 == (OBJ_DATA *)0x0) {
      local_38 = 0;
      local_1c = 0;
      uVar6 = 0;
      while( true ) {
        pvVar5 = std::vector<weapon_type,_std::allocator<weapon_type>_>::operator[]
                           (&weapon_table,(long)local_1c);
        iVar2 = (int)((ulong)uVar6 >> 0x20);
        if (pvVar5->name == (char *)0x0) break;
        pCVar3 = char_data::Class(ch_00);
        iVar2 = CClass::GetIndex(pCVar3);
        if ((iVar2 == 1) && (in_RDI->pcdata->start_weapon == local_1c)) {
          std::vector<weapon_type,_std::allocator<weapon_type>_>::operator[]
                    (&weapon_table,(long)local_1c);
        }
        else {
          in_stack_ffffffffffffff4c = (int)in_RDI->pcdata->learned[local_38];
          in_stack_ffffffffffffff40 = in_RDI->pcdata;
          pvVar5 = std::vector<weapon_type,_std::allocator<weapon_type>_>::operator[]
                             (&weapon_table,(long)local_1c);
          if (in_stack_ffffffffffffff4c < in_stack_ffffffffffffff40->learned[*pvVar5->gsn]) {
            pvVar5 = std::vector<weapon_type,_std::allocator<weapon_type>_>::operator[]
                               (&weapon_table,(long)local_1c);
            local_38 = (int)*pvVar5->gsn;
            std::vector<weapon_type,_std::allocator<weapon_type>_>::operator[]
                      (&weapon_table,(long)local_1c);
          }
        }
        local_1c = local_1c + 1;
      }
      get_obj_index(in_stack_ffffffffffffff4c);
      create_object(in_RSI,iVar2);
      obj_to_char((OBJ_DATA *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      wear_obj(in_stack_00001200,in_stack_000011f8,(bool)in_stack_000011f7);
    }
    pOVar4 = get_eq_char(in_RDI,0x10);
    if ((((pOVar4 == (OBJ_DATA *)0x0) ||
         (bVar1 = is_weapon_stat((OBJ_DATA *)
                                 CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                                 (int)((ulong)in_stack_ffffffffffffff40 >> 0x20)), !bVar1)) &&
        (pOVar4 = get_eq_char(in_RDI,0), pOVar4 == (OBJ_DATA *)0x0)) &&
       (pOVar4 = get_eq_char(in_RDI,0xb), pOVar4 == (OBJ_DATA *)0x0)) {
      get_obj_index(in_stack_ffffffffffffff4c);
      pOVar4 = create_object(in_RSI,(int)((ulong)pOVar4 >> 0x20));
      pOVar4->cost = 0;
      obj_to_char((OBJ_DATA *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      wear_obj(in_stack_00001200,in_stack_000011f8,(bool)in_stack_000011f7);
    }
    iVar2 = (int)((ulong)pOVar4 >> 0x20);
    get_obj_index(in_stack_ffffffffffffff4c);
    pOVar4 = create_object(in_RSI,iVar2);
    pOVar4->cost = 0;
    obj_to_char((OBJ_DATA *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    iVar2 = (int)((ulong)pOVar4 >> 0x20);
    get_obj_index(in_stack_ffffffffffffff4c);
    pOVar4 = create_object(in_RSI,iVar2);
    pOVar4->cost = 0;
    obj_to_char((OBJ_DATA *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    iVar2 = (int)((ulong)pOVar4 >> 0x20);
    get_obj_index(in_stack_ffffffffffffff4c);
    pOVar4 = create_object(in_RSI,iVar2);
    pOVar4->cost = 0;
    obj_to_char((OBJ_DATA *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    send_to_char((char *)ch_00,
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    init_affect((AFFECT_DATA *)0x586f1a);
    skill_lookup((char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    std::pow<int,int>(0,0x586f57);
    affect_to_char((CHAR_DATA *)in_stack_ffffffffffffff40,(AFFECT_DATA *)in_stack_ffffffffffffff38);
  }
  else {
    send_to_char((char *)ch_00,
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  }
  return;
}

Assistant:

void do_outfit(CHAR_DATA *ch, char *argument)
{
	OBJ_DATA *obj;
	int i, body, arms, legs, hands, feet, shield, sn, vnum;
	AFFECT_DATA af;

	if (is_affected(ch, skill_lookup("outfit")))
	{
		send_to_char("You have outfitted too recently and cannot do so again.\n\r", ch);
		return;
	}

	if (ch->level > 25 && !is_immortal(ch))
	{
		send_to_char("You are far too experienced to outfit yourself.\n\r", ch);
		return;
	}

	ch->pcdata->condition[COND_THIRST] = 1;
	ch->pcdata->condition[COND_HUNGER] = 1;

	if (ch->Class()->GetIndex() == CLASS_SORCERER || ch->Class()->GetIndex() == CLASS_NECROMANCER)
	{
		body = 24570;
		arms = 24572;
		legs = 24574;
		hands = 24576;
		feet = 24578;
		shield = 24580;
	}
	else
	{
		body = 24571;
		arms = 24573;
		legs = 24575;
		hands = 24577;
		feet = 24579;
		shield = 24580;
	}

	obj = get_eq_char(ch, WEAR_BODY);

	if (obj == nullptr)
	{
		obj = create_object(get_obj_index(body), 0);
		obj->cost = 0;
		obj_to_char(obj, ch);
		wear_obj(ch, obj, false);
	}
	/*
	obj = get_eq_char(ch, WEAR_HEAD);
	if (obj == nullptr)
	{
		obj = create_object(get_obj_index(3706), 0);
		obj->cost = 0;
		obj_to_char(obj, ch);
		wear_obj(ch, obj, false);
	}

	obj = get_eq_char(ch, WEAR_NECK_1);
	if (obj == nullptr)
	{
		obj = create_object(get_obj_index(3705), 0);
		obj->cost = 0;
		obj_to_char(obj, ch);
		wear_obj(ch, obj, false);
	}

	obj = get_eq_char(ch, WEAR_NECK_2);
	if (obj == nullptr)
	{
		obj = create_object(get_obj_index(3705), 0);
		obj->cost = 0;
		obj_to_char(obj, ch);
		wear_obj(ch, obj, false);
	}
	*/

	obj = get_eq_char(ch, WEAR_LEGS);

	if (obj == nullptr)
	{
		obj = create_object(get_obj_index(legs), 0);
		obj->cost = 0;
		obj_to_char(obj, ch);
		wear_obj(ch, obj, false);
	}

	obj = get_eq_char(ch, WEAR_FEET);

	if (obj == nullptr)
	{
		obj = create_object(get_obj_index(feet), 0);
		obj->cost = 0;
		obj_to_char(obj, ch);
		wear_obj(ch, obj, false);
	}

	obj = get_eq_char(ch, WEAR_HANDS);

	if (obj == nullptr)
	{
		obj = create_object(get_obj_index(hands), 0);
		obj->cost = 0;
		obj_to_char(obj, ch);
		wear_obj(ch, obj, false);
	}

	obj = get_eq_char(ch, WEAR_ARMS);

	if (obj == nullptr)
	{
		obj = create_object(get_obj_index(arms), 0);
		obj->cost = 0;
		obj_to_char(obj, ch);
		wear_obj(ch, obj, false);
	}

	/*
	obj = get_eq_char(ch, WEAR_ABOUT);
	if (obj == nullptr)
	{
		obj = create_object(get_obj_index(3711), 0);
		obj->cost = 0;
		obj_to_char(obj, ch);
		wear_obj(ch, obj, false);
	}

	obj = get_eq_char(ch, WEAR_WAIST);
	if (obj == nullptr)
	{
		obj = create_object(get_obj_index(3712), 0);
		obj->cost = 0;
		obj_to_char(obj, ch);
		wear_obj(ch, obj, false);
	}

	obj = get_eq_char(ch, WEAR_WRIST_L);
	if (obj == nullptr)
	{
		obj = create_object(get_obj_index(3713), 0);
		obj->cost = 0;
		obj_to_char(obj, ch);
		wear_obj(ch, obj, false);
	}

	obj = get_eq_char(ch, WEAR_WRIST_R);
	if (obj == nullptr)
	{
		obj = create_object(get_obj_index(3713), 0);
		obj->cost = 0;
		obj_to_char(obj, ch);
		wear_obj(ch, obj, false);
	}
	*/

	/* do the weapon thing*/
	obj = get_eq_char(ch, WEAR_WIELD);

	if (obj == nullptr)
	{
		sn = 0;
		vnum = OBJ_VNUM_SCHOOL_SWORD;

		for (i = 0; weapon_table[i].name != nullptr; i++)
		{
			if (ch->Class()->GetIndex() == CLASS_WARRIOR && ch->pcdata->start_weapon == i)
			{
				vnum = weapon_table[i].vnum;
			}
			else if (ch->pcdata->learned[sn] < ch->pcdata->learned[*weapon_table[i].gsn])
			{
				sn = *weapon_table[i].gsn;
				vnum = weapon_table[i].vnum;
			}
		}

		obj = create_object(get_obj_index(vnum), 0);
		obj_to_char(obj, ch);
		wear_obj(ch, obj, false);
	}

	obj = get_eq_char(ch, WEAR_WIELD);

	if ((obj == nullptr || !is_weapon_stat(obj, WEAPON_TWO_HANDS))
		&& (obj = get_eq_char(ch, WEAR_LIGHT)) == nullptr
		&& (obj = get_eq_char(ch, WEAR_SHIELD)) == nullptr)
	{
		obj = create_object(get_obj_index(OBJ_VNUM_SCHOOL_SHIELD), 0);
		obj->cost = 0;
		obj_to_char(obj, ch);
		wear_obj(ch, obj, false);
	}

	/*
	for(i=24580; i < 24590; i++)
	{
		obj = create_object(get_obj_index(i), 0);
		obj->cost = 0;
		obj_to_char(obj, ch);
	}
	*/

	obj = create_object(get_obj_index(311), 0);
	obj->cost = 0;
	obj_to_char(obj, ch);

	obj = create_object(get_obj_index(2794), 0);
	obj->cost = 0;
	obj_to_char(obj, ch);

	obj = create_object(get_obj_index(24534), 0);
	obj->cost = 0;
	obj_to_char(obj, ch);

	send_to_char("You have been equipped by the gods.\n\r", ch);

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.aftype = AFT_POWER;
	af.type = skill_lookup("outfit");
	af.location = 0;
	af.duration = 80;

	SET_BIT(af.bitvector, AFF_DARK_VISION);

	af.modifier = 0;
	af.level = ch->level;
	af.mod_name = MOD_WARDROBE;
	affect_to_char(ch, &af);
}